

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InteractionManager.cpp
# Opt level: O1

RealType __thiscall
OpenMD::InteractionManager::getSuggestedCutoffRadius(InteractionManager *this,int *atid)

{
  mapped_type pAVar1;
  mapped_type *ppAVar2;
  _Rb_tree_node_base *p_Var3;
  long lVar4;
  double dVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  ppAVar2 = std::
            map<int,_OpenMD::AtomType_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::AtomType_*>_>_>
            ::operator[](&this->typeMap_,atid);
  lVar4 = (long)*atid * 0x30 +
          *(long *)&(this->interactions_).
                    super__Vector_base<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>,_std::allocator<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[*atid].
                    super__Vector_base<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>
                    ._M_impl.super__Vector_impl_data;
  p_Var3 = *(_Rb_tree_node_base **)(lVar4 + 0x18);
  if (p_Var3 == (_Rb_tree_node_base *)(lVar4 + 8)) {
    dVar5 = 0.0;
  }
  else {
    pAVar1 = *ppAVar2;
    uVar6 = 0;
    uVar7 = 0;
    do {
      dVar5 = (double)(**(code **)(**(long **)(p_Var3 + 1) + 0x28))
                                (*(long **)(p_Var3 + 1),pAVar1,pAVar1);
      if (dVar5 <= (double)CONCAT44(uVar7,uVar6)) {
        dVar5 = (double)CONCAT44(uVar7,uVar6);
      }
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      uVar6 = SUB84(dVar5,0);
      uVar7 = (undefined4)((ulong)dVar5 >> 0x20);
    } while (p_Var3 != (_Rb_tree_node_base *)
                       ((long)*atid * 0x30 +
                        *(long *)&(this->interactions_).
                                  super__Vector_base<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>,_std::allocator<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[*atid].
                                  super__Vector_base<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data + 8));
  }
  return dVar5;
}

Assistant:

RealType InteractionManager::getSuggestedCutoffRadius(int* atid) {
    if (!initialized_) initialize();

    AtomType* atype = typeMap_[*atid];

    set<NonBondedInteractionPtr>::iterator it;
    RealType cutoff = 0.0;

    for (it = interactions_[*atid][*atid].begin();
         it != interactions_[*atid][*atid].end(); ++it) {
      cutoff =
          max(cutoff, (*it)->getSuggestedCutoffRadius(make_pair(atype, atype)));
    }
    return cutoff;
  }